

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void walChecksumBytes(int nativeCksum,u8 *a,int nByte,u32 *aIn,u32 *aOut)

{
  u32 *puVar1;
  u32 *aEnd;
  u32 *aData;
  u32 s2;
  u32 s1;
  u32 *aOut_local;
  u32 *aIn_local;
  int nByte_local;
  u8 *a_local;
  int nativeCksum_local;
  
  if (aIn == (u32 *)0x0) {
    aData._0_4_ = 0;
    aData._4_4_ = 0;
  }
  else {
    aData._4_4_ = *aIn;
    aData._0_4_ = aIn[1];
  }
  aEnd = (u32 *)a;
  if (nativeCksum == 0) {
    do {
      aData._4_4_ = *aEnd * 0x1000000 + (*aEnd & 0xff00) * 0x100 + ((*aEnd & 0xff0000) >> 8) +
                    (*aEnd >> 0x18) + (u32)aData + aData._4_4_;
      aData._0_4_ = aEnd[1] * 0x1000000 + (aEnd[1] & 0xff00) * 0x100 + ((aEnd[1] & 0xff0000) >> 8) +
                    (aEnd[1] >> 0x18) + aData._4_4_ + (u32)aData;
      aEnd = aEnd + 2;
    } while (aEnd < a + nByte);
  }
  else {
    do {
      puVar1 = aEnd + 1;
      aData._4_4_ = *aEnd + (u32)aData + aData._4_4_;
      aEnd = aEnd + 2;
      aData._0_4_ = *puVar1 + aData._4_4_ + (u32)aData;
    } while (aEnd < a + nByte);
  }
  *aOut = aData._4_4_;
  aOut[1] = (u32)aData;
  return;
}

Assistant:

static void walChecksumBytes(
  int nativeCksum, /* True for native byte-order, false for non-native */
  u8 *a,           /* Content to be checksummed */
  int nByte,       /* Bytes of content in a[].  Must be a multiple of 8. */
  const u32 *aIn,  /* Initial checksum value input */
  u32 *aOut        /* OUT: Final checksum value output */
){
  u32 s1, s2;
  u32 *aData = (u32 *)a;
  u32 *aEnd = (u32 *)&a[nByte];

  if( aIn ){
    s1 = aIn[0];
    s2 = aIn[1];
  }else{
    s1 = s2 = 0;
  }

  assert( nByte>=8 );
  assert( (nByte&0x00000007)==0 );
  assert( nByte<=65536 );

  if( nativeCksum ){
    do {
      s1 += *aData++ + s2;
      s2 += *aData++ + s1;
    }while( aData<aEnd );
  }else{
    do {
      s1 += BYTESWAP32(aData[0]) + s2;
      s2 += BYTESWAP32(aData[1]) + s1;
      aData += 2;
    }while( aData<aEnd );
  }

  aOut[0] = s1;
  aOut[1] = s2;
}